

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodePtr __thiscall
Parser::ParseArgList<true>
          (Parser *this,bool *pCallOfConstants,uint16 *pSpreadArgCount,uint16 *pCount)

{
  code *pcVar1;
  bool bVar2;
  tokens tVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Scanner_t *pSVar6;
  ScriptConfiguration *this_00;
  undefined1 local_68 [8];
  IdentToken token;
  ParseNode **ppPStack_48;
  int count;
  ParseNodePtr *lastNodeRef;
  ParseNodePtr pnodeList;
  ParseNodePtr pnodeArg;
  uint16 *pCount_local;
  uint16 *pSpreadArgCount_local;
  bool *pCallOfConstants_local;
  Parser *this_local;
  
  lastNodeRef = (ParseNodePtr *)0x0;
  ppPStack_48 = (ParseNode **)0x0;
  pnodeArg = (ParseNodePtr)pCount;
  pCount_local = pSpreadArgCount;
  pSpreadArgCount_local = (uint16 *)pCallOfConstants;
  pCallOfConstants_local = (bool *)this;
  if ((this->m_token).tk != tkLParen) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x10dc,"(m_token.tk == tkLParen)","m_token.tk == tkLParen");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar6 = GetScanner(this);
  tVar3 = Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar6);
  if (tVar3 == tkRParen) {
    this_local = (Parser *)0x0;
  }
  else {
    *(undefined1 *)pSpreadArgCount_local = 1;
    *pCount_local = 0;
    token.ichLim = 0;
    do {
      do {
        if (0xfff8 < (int)token.ichLim) {
          Error(this,-0x7ff5fbfb,L"",L"");
        }
        IdentToken::IdentToken((IdentToken *)local_68);
        pnodeList = ParseExpr<true>(this,1,(BOOL *)0x0,1,1,(LPCOLESTR)0x0,(uint32 *)0x0,
                                    (uint32 *)0x0,(IdentToken *)local_68,false,(bool *)0x0,
                                    (charcount_t *)0x0,(bool *)0x0);
        token.ichLim = token.ichLim + 1;
        MarkEscapingRef(this,pnodeList,(IdentToken *)local_68);
        CheckArguments(this,pnodeList);
        if (((*pSpreadArgCount_local & 1) != 0) &&
           (BVar4 = IsConstantInFunctionCall(this,pnodeList), BVar4 == 0)) {
          *(undefined1 *)pSpreadArgCount_local = 0;
        }
        if (pnodeList->nop == knopEllipsis) {
          *pCount_local = *pCount_local + 1;
        }
        AddToNodeListEscapedUse(this,(ParseNode **)&lastNodeRef,&stack0xffffffffffffffb8,pnodeList);
        if ((this->m_token).tk != tkComma) goto LAB_01560bce;
        pSVar6 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar6);
      } while ((this->m_token).tk != tkRParen);
      this_00 = Js::ScriptContext::GetConfig(this->m_scriptContext);
      bVar2 = Js::ScriptConfiguration::IsES7TrailingCommaEnabled(this_00);
    } while (!bVar2);
LAB_01560bce:
    *(short *)pnodeArg = (short)token.ichLim;
    if (ppPStack_48 == (ParseNode **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1116,"(lastNodeRef)","lastNodeRef");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (*ppPStack_48 == (ParseNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1117,"(*lastNodeRef)","*lastNodeRef");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    *(charcount_t *)(lastNodeRef + 1) = (*ppPStack_48)->ichLim;
    this_local = (Parser *)lastNodeRef;
  }
  return (ParseNodePtr)this_local;
}

Assistant:

ParseNodePtr Parser::ParseArgList(bool *pCallOfConstants, uint16 *pSpreadArgCount, uint16 * pCount)
{
    ParseNodePtr pnodeArg;
    ParseNodePtr pnodeList = nullptr;
    ParseNodePtr *lastNodeRef = nullptr;

    // Check for an empty list
    Assert(m_token.tk == tkLParen);

    if (this->GetScanner()->Scan() == tkRParen)
    {
        return nullptr;
    }

    *pCallOfConstants = true;
    *pSpreadArgCount = 0;

    int count = 0;
    while (true)
    {
        if (count >= Js::Constants::MaxAllowedArgs)
        {
            Error(ERRTooManyArgs);
        }
        // Allow spread in argument lists.
        IdentToken token;
        pnodeArg = ParseExpr<buildAST>(koplCma, nullptr, TRUE, /* fAllowEllipsis */TRUE, NULL, nullptr, nullptr, &token);
        ++count;
        this->MarkEscapingRef(pnodeArg, &token);

        if (buildAST)
        {
            this->CheckArguments(pnodeArg);

            if (*pCallOfConstants && !IsConstantInFunctionCall(pnodeArg))
            {
                *pCallOfConstants = false;
            }

            if (pnodeArg->nop == knopEllipsis)
            {
                (*pSpreadArgCount)++;
            }

            AddToNodeListEscapedUse(&pnodeList, &lastNodeRef, pnodeArg);
        }
        if (m_token.tk != tkComma)
        {
            break;
        }
        this->GetScanner()->Scan();

        if (m_token.tk == tkRParen && m_scriptContext->GetConfig()->IsES7TrailingCommaEnabled())
        {
            break;
        }
    }

    if (pSpreadArgCount != nullptr && (*pSpreadArgCount) > 0) {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, SpreadFeature, m_scriptContext);
    }

    *pCount = static_cast<uint16>(count);
    if (buildAST)
    {
        Assert(lastNodeRef);
        Assert(*lastNodeRef);
        pnodeList->ichLim = (*lastNodeRef)->ichLim;
    }

    return pnodeList;
}